

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extract_tar_lzo.c
# Opt level: O2

void test_extract_tar_lzo(void)

{
  wchar_t wVar1;
  
  extract_reference_file("test_extract.tar.lzo");
  wVar1 = systemf("%s -tf %s >test.out 2>test.err",testprog,"test_extract.tar.lzo");
  if (wVar1 != L'\0') {
    wVar1 = canLzop();
    if (wVar1 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_extract_tar_lzo.c"
                     ,L'.');
      test_skipping("It seems lzop is not supported on this platform");
      return;
    }
  }
  wVar1 = systemf("%s -xf %s >test.out 2>test.err",testprog,"test_extract.tar.lzo");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_extract_tar_lzo.c"
                      ,L'%',0,"0",(long)wVar1,
                      "systemf(\"%s -xf %s >test.out 2>test.err\", testprog, reffile)",(void *)0x0);
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_extract_tar_lzo.c"
             ,L'\'',"file1");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_extract_tar_lzo.c"
             ,L'(',"contents of file1.\n","file1");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_extract_tar_lzo.c"
             ,L')',"file2");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_extract_tar_lzo.c"
             ,L'*',"contents of file2.\n","file2");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_extract_tar_lzo.c"
             ,L'+',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_extract_tar_lzo.c"
             ,L',',"test.err");
  return;
}

Assistant:

DEFINE_TEST(test_extract_tar_lzo)
{
	const char *reffile = "test_extract.tar.lzo";
	int f;

	extract_reference_file(reffile);
	f = systemf("%s -tf %s >test.out 2>test.err", testprog, reffile);
	if (f == 0 || canLzop()) {
		assertEqualInt(0, systemf("%s -xf %s >test.out 2>test.err",
		    testprog, reffile));

		assertFileExists("file1");
		assertTextFileContents("contents of file1.\n", "file1");
		assertFileExists("file2");
		assertTextFileContents("contents of file2.\n", "file2");
		assertEmptyFile("test.out");
		assertEmptyFile("test.err");
	} else {
		skipping("It seems lzop is not supported on this platform");
	}
}